

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildAsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset)

{
  byte *pbVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  RegOpnd *src1;
  RegOpnd *this_00;
  Instr *pIVar8;
  IntConstOpnd *src1_00;
  uint i;
  long lVar9;
  undefined6 in_register_00000032;
  
  bVar3 = OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode);
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0x230 || !bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x174a,
                       "(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode) && newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_V8X16)"
                       ,
                       "OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode) && newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_V8X16"
                      );
    if (!bVar3) goto LAB_0053c898;
    *puVar6 = 0;
  }
  pbVar1 = (this->m_jnReader).m_currentLocation;
  (this->m_jnReader).m_currentLocation = pbVar1 + 0x1c;
  if ((this->m_jnReader).m_endLocation < pbVar1 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                       ,0x68,"(m_currentLocation <= m_endLocation)",
                       "m_currentLocation <= m_endLocation");
    if (!bVar3) goto LAB_0053c898;
    *puVar6 = 0;
  }
  RVar5 = GetRegSlotFromTypedReg(this,*(RegSlot *)(pbVar1 + 0x14),SIMD);
  pRVar7 = BuildSrcOpnd(this,RVar5,TySimd128U16);
  RVar5 = GetRegSlotFromTypedReg(this,*(RegSlot *)(pbVar1 + 0x18),SIMD);
  src1 = BuildSrcOpnd(this,RVar5,TySimd128U16);
  RVar5 = GetRegSlotFromTypedReg(this,*(RegSlot *)(pbVar1 + 0x10),SIMD);
  this_00 = BuildDstOpnd(this,RVar5,TySimd128U16);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&pRVar7->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&src1->super_Opnd,(ValueType)0x4000);
  pIVar8 = AddExtendedArg(this,pRVar7,(RegOpnd *)0x0,offset);
  pRVar7 = (RegOpnd *)pIVar8->m_dst;
  OVar4 = IR::Opnd::GetKind((Opnd *)pRVar7);
  if (OVar4 == OpndKindReg) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_0053c898:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pIVar8 = AddExtendedArg(this,src1,pRVar7,offset);
  lVar9 = 0;
  do {
    src1_00 = IR::IntConstOpnd::New((ulong)pbVar1[lVar9],TyInt32,this->m_func,false);
    pRVar7 = (RegOpnd *)pIVar8->m_dst;
    OVar4 = IR::Opnd::GetKind((Opnd *)pRVar7);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_0053c898;
      *puVar6 = 0;
    }
    pIVar8 = AddExtendedArg(this,(RegOpnd *)src1_00,pRVar7,offset);
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x10) {
      pIVar8 = IR::Instr::New(Simd128_Shuffle_U16,&this_00->super_Opnd,pIVar8->m_dst,this->m_func);
      AddInstr(this,pIVar8,offset);
      return;
    }
  } while( true );
}

Assistant:

void
IRBuilderAsmJs::BuildAsmShuffle(Js::OpCodeAsmJs newOpcode, uint32 offset)
{
    Assert(OpCodeAttrAsmJs::HasMultiSizeLayout(newOpcode) && newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_V8X16);
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_AsmShuffle<SizePolicy>>();

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(GetRegSlotFromSimd128Reg(layout->R1), TySimd128U16);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(GetRegSlotFromSimd128Reg(layout->R2), TySimd128U16);
    IR::RegOpnd * dstOpnd = BuildDstOpnd(GetRegSlotFromSimd128Reg(layout->R0), TySimd128U16);
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);

    IR::Instr * instr = nullptr;
    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);

    for (uint i = 0; i < Wasm::Simd::MAX_LANES; i++)
    {
        IR::RegOpnd* shuffleOpnd = (IR::RegOpnd*)IR::IntConstOpnd::New(layout->INDICES[i], TyInt32, this->m_func);
        instr = AddExtendedArg(shuffleOpnd, instr->GetDst()->AsRegOpnd(), offset);
    }
    AddInstr(IR::Instr::New(Js::OpCode::Simd128_Shuffle_U16, dstOpnd, instr->GetDst(), m_func), offset);
}